

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PopFont(void)

{
  int iVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  ImFont **ppIVar4;
  ImFont *font;
  
  pIVar2 = GImGui;
  ImDrawList::PopTextureID(GImGui->CurrentWindow->DrawList);
  iVar1 = (pIVar2->FontStack).Size;
  iVar3 = iVar1 + -1;
  (pIVar2->FontStack).Size = iVar3;
  if (iVar3 == 0) {
    font = (GImGui->IO).FontDefault;
    if (font != (ImFont *)0x0) goto LAB_00119bef;
    ppIVar4 = (((GImGui->IO).Fonts)->Fonts).Data;
  }
  else {
    ppIVar4 = (pIVar2->FontStack).Data + (long)iVar1 + -2;
  }
  font = *ppIVar4;
LAB_00119bef:
  SetCurrentFont(font);
  return;
}

Assistant:

void  ImGui::PopFont()
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow->DrawList->PopTextureID();
    g.FontStack.pop_back();
    SetCurrentFont(g.FontStack.empty() ? GetDefaultFont() : g.FontStack.back());
}